

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Stack.h
# Opt level: O0

void __thiscall w3Stack::push_label(w3Stack *this,w3StackValue *value)

{
  string local_38;
  w3StackValue *local_18;
  w3StackValue *value_local;
  w3Stack *this_local;
  
  local_18 = value;
  value_local = (w3StackValue *)this;
  if (value->tag != Tag_Label) {
    StringFormat_abi_cxx11_(&local_38,"%X %X",(ulong)value->tag,0x81);
    AssertFailedFormat("value.tag == Tag_Label",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  w3StackBase::push(&this->super_w3StackBase,local_18);
  return;
}

Assistant:

void push_label (const w3StackValue& value)
    {
        AssertFormat (value.tag == Tag_Label, ("%X %X", value.tag, Tag_Label));
        push (value);
        //printf ("push_label depth:%" FORMAT_SIZE "X\n", size ());
    }